

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

TraceNo trace_findfree(jit_State *J)

{
  TraceNo TVar1;
  GCRef *pGVar2;
  MSize local_20;
  uint local_1c;
  MSize lim;
  MSize osz;
  jit_State *J_local;
  
  if (J->freetrace == 0) {
    J->freetrace = 1;
  }
  while( true ) {
    if (J->sizetrace <= J->freetrace) {
      local_20 = J->param[0] + 1;
      if (local_20 < 2) {
        local_20 = 2;
      }
      else if (0xffff < local_20) {
        local_20 = 0xffff;
      }
      local_1c = J->sizetrace;
      if (local_1c < local_20) {
        pGVar2 = (GCRef *)lj_mem_grow(J->L,J->trace,&J->sizetrace,local_20,8);
        J->trace = pGVar2;
        for (; local_1c < J->sizetrace; local_1c = local_1c + 1) {
          J->trace[local_1c].gcptr64 = 0;
        }
        J_local._4_4_ = J->freetrace;
      }
      else {
        J_local._4_4_ = 0;
      }
      return J_local._4_4_;
    }
    if (J->trace[J->freetrace].gcptr64 == 0) break;
    J->freetrace = J->freetrace + 1;
  }
  TVar1 = J->freetrace;
  J->freetrace = TVar1 + 1;
  return TVar1;
}

Assistant:

static TraceNo trace_findfree(jit_State *J)
{
  MSize osz, lim;
  if (J->freetrace == 0)
    J->freetrace = 1;
  for (; J->freetrace < J->sizetrace; J->freetrace++)
    if (traceref(J, J->freetrace) == NULL)
      return J->freetrace++;
  /* Need to grow trace array. */
  lim = (MSize)J->param[JIT_P_maxtrace] + 1;
  if (lim < 2) lim = 2; else if (lim > 65535) lim = 65535;
  osz = J->sizetrace;
  if (osz >= lim)
    return 0;  /* Too many traces. */
  lj_mem_growvec(J->L, J->trace, J->sizetrace, lim, GCRef);
  for (; osz < J->sizetrace; osz++)
    setgcrefnull(J->trace[osz]);
  return J->freetrace;
}